

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O3

bool __thiscall CNetAddr::IsAddrV1Compatible(CNetAddr *this)

{
  Network NVar1;
  bool bVar2;
  long in_FS_OFFSET;
  
  NVar1 = this->m_net;
  if (NET_MAX < NVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                  ,0x1f1,"bool CNetAddr::IsAddrV1Compatible() const");
  }
  if ((0x38U >> (NVar1 & 0x1f) & 1) == 0) {
    bVar2 = true;
    if ((0x46U >> (NVar1 & 0x1f) & 1) == 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/netaddress.cpp"
                    ,0x1ee,"bool CNetAddr::IsAddrV1Compatible() const");
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CNetAddr::IsAddrV1Compatible() const
{
    switch (m_net) {
    case NET_IPV4:
    case NET_IPV6:
    case NET_INTERNAL:
        return true;
    case NET_ONION:
    case NET_I2P:
    case NET_CJDNS:
        return false;
    case NET_UNROUTABLE: // m_net is never and should not be set to NET_UNROUTABLE
    case NET_MAX:        // m_net is never and should not be set to NET_MAX
        assert(false);
    } // no default case, so the compiler can warn about missing cases

    assert(false);
}